

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_peek_bitset.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::hash_peek_bitset<char>::test_icase_
          (hash_peek_bitset<char> *this,bool icase)

{
  size_t sVar1;
  byte in_SIL;
  byte *in_RDI;
  size_t count;
  undefined1 local_1;
  
  sVar1 = std::bitset<256UL>::count((bitset<256UL> *)0x14a5c4);
  if (sVar1 == 0x100) {
    local_1 = false;
  }
  else if ((sVar1 == 0) || ((*in_RDI & 1) == (in_SIL & 1))) {
    *in_RDI = in_SIL & 1;
    local_1 = true;
  }
  else {
    set_all((hash_peek_bitset<char> *)0x14a607);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool test_icase_(bool icase)
    {
        std::size_t count = this->bset_.count();

        if(256 == count)
        {
            return false; // all set already, nothing to do
        }
        else if(0 != count && this->icase_ != icase)
        {
            this->set_all(); // icase mismatch! set all and bail
            return false;
        }

        this->icase_ = icase;
        return true;
    }